

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::Flip
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,bool horizontal,bool vertical)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *puVar6;
  uchar *puVar7;
  byte bVar8;
  ImageTemplate<unsigned_char> *in_RCX;
  uint32_t in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint in_R8D;
  int in_R9D;
  uint in_stack_00000008;
  int in_stack_00000010;
  byte in_stack_00000018;
  byte in_stack_00000020;
  uint8_t *inXEnd_1;
  uint8_t *outX_1;
  uint8_t *inX_1;
  uint8_t *outY_2;
  uint8_t *outY_1;
  uint8_t *inXEnd;
  uint8_t *outX;
  uint8_t *inX;
  uint8_t *outY;
  uint8_t *inYEnd;
  uint8_t *inY;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  uint uVar9;
  undefined4 in_stack_ffffffffffffff0c;
  int iVar10;
  undefined4 in_stack_ffffffffffffff14;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff40;
  uchar *local_b8;
  uint32_t in_stack_ffffffffffffff50;
  uint32_t in_stack_ffffffffffffff58;
  uchar *local_a0;
  uchar *local_90;
  uchar *local_88;
  uchar *local_80;
  undefined8 in_stack_ffffffffffffff88;
  Image *in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint32_t in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb8;
  
  bVar8 = in_stack_00000018 & 1;
  bVar1 = in_stack_00000020 & 1;
  uVar9 = in_stack_00000008;
  iVar10 = in_stack_00000010;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_ESI,in_EDX,
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff58);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff14,iVar10),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff0c,uVar9));
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff14,iVar10),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff0c,uVar9));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x121b69);
  if ((bVar8 == 0) && (bVar1 == 0)) {
    Copy((Image *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
         in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
         (uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),(uint32_t)in_stack_ffffffffffffff88,
         in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
  }
  else {
    uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
    uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
    puVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
    puVar4 = puVar4 + (ulong)in_ESI + (ulong)(in_EDX * uVar2);
    puVar5 = puVar4 + in_stack_00000010 * uVar2;
    if ((bVar8 == 0) || (bVar1 != 0)) {
      if ((bVar8 == 0) && (bVar1 != 0)) {
        local_a0 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
        local_a0 = local_a0 + (ulong)in_R8D + (ulong)((in_R9D + in_stack_00000010 + -1) * uVar3);
        for (; puVar4 != puVar5; puVar4 = puVar4 + uVar2) {
          memcpy(local_a0,puVar4,(ulong)in_stack_00000008);
          local_a0 = local_a0 + -(ulong)uVar3;
        }
      }
      else {
        puVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
        puVar6 = puVar6 + (ulong)in_stack_00000008 +
                          (ulong)in_R8D + (ulong)((in_R9D + in_stack_00000010 + -1) * uVar3) + -1;
        for (; puVar4 != puVar5; puVar4 = puVar4 + uVar2) {
          local_b8 = puVar6;
          for (puVar7 = puVar4; puVar7 != puVar4 + in_stack_00000008; puVar7 = puVar7 + 1) {
            *local_b8 = *puVar7;
            local_b8 = local_b8 + -1;
          }
          puVar6 = puVar6 + -(ulong)uVar3;
        }
      }
    }
    else {
      local_80 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
      local_80 = local_80 + (ulong)in_stack_00000008 + (ulong)in_R8D + (ulong)(in_R9D * uVar3) + -1;
      for (; puVar4 != puVar5; puVar4 = puVar4 + uVar2) {
        local_90 = local_80;
        for (local_88 = puVar4; local_88 != puVar4 + in_stack_00000008; local_88 = local_88 + 1) {
          *local_90 = *local_88;
          local_90 = local_90 + -1;
        }
        local_80 = local_80 + uVar3;
      }
    }
  }
  return;
}

Assistant:

void Flip( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
               uint32_t width, uint32_t height, bool horizontal, bool vertical )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );

        if( !horizontal && !vertical ) {
            Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        }
        else {
            const uint32_t rowSizeIn  = in.rowSize();
            const uint32_t rowSizeOut = out.rowSize();

            const uint8_t * inY    = in.data() + startYIn * rowSizeIn + startXIn;
            const uint8_t * inYEnd = inY + height * rowSizeIn;

            if( horizontal && !vertical ) {
                uint8_t * outY = out.data() + startYOut * rowSizeOut + startXOut + width - 1;

                for( ; inY != inYEnd; inY += rowSizeIn, outY += rowSizeOut ) {
                    const uint8_t * inX    = inY;
                    uint8_t       * outX   = outY;
                    const uint8_t * inXEnd = inX + width;

                    for( ; inX != inXEnd; ++inX, --outX )
                        (*outX) = (*inX);
                }
            }
            else if( !horizontal && vertical ) {
                uint8_t * outY = out.data() + (startYOut + height - 1) * rowSizeOut + startXOut;

                for( ; inY != inYEnd; inY += rowSizeIn, outY -= rowSizeOut )
                    memcpy( outY, inY, sizeof( uint8_t ) * width );
            }
            else {
                uint8_t * outY = out.data() + (startYOut + height - 1) * rowSizeOut + startXOut + width - 1;

                for( ; inY != inYEnd; inY += rowSizeIn, outY -= rowSizeOut ) {
                    const uint8_t * inX    = inY;
                    uint8_t       * outX   = outY;
                    const uint8_t * inXEnd = inX + width;

                    for( ; inX != inXEnd; ++inX, --outX )
                        (*outX) = (*inX);
                }
            }
        }
    }